

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O3

bool __thiscall
ON_ArchivableDictionary::Read(ON_ArchivableDictionary *this,ON_BinaryArchive *binary_archive)

{
  DictionaryEntry *pDVar1;
  bool bVar2;
  int iVar3;
  DictionaryEntry *pDVar4;
  mapped_type *pmVar5;
  int item_type;
  ON_wString item_name;
  ON_wString dictionary_name;
  uint dictionary_version;
  ON_UUID dictionary_id;
  DictionaryEntryType local_64;
  ON_wString local_60;
  ON_wString local_58;
  uint local_4c;
  ON_UUID local_48;
  
  local_48.Data1 = 0;
  local_48.Data2 = 0;
  local_48.Data3 = 0;
  local_48.Data4[0] = '\0';
  local_48.Data4[1] = '\0';
  local_48.Data4[2] = '\0';
  local_48.Data4[3] = '\0';
  local_48.Data4[4] = '\0';
  local_48.Data4[5] = '\0';
  local_48.Data4[6] = '\0';
  local_48.Data4[7] = '\0';
  local_4c = 0;
  ON_wString::ON_wString(&local_58);
  std::
  _Rb_tree<ON_wString,_std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>,_std::_Select1st<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
  ::clear(&(this->m_private->m_map)._M_t);
  bVar2 = ON_BinaryArchive::BeginReadDictionary(binary_archive,&local_48,&local_4c,&local_58);
  if (bVar2) {
    bVar2 = ::operator!=(&local_48,&RhinoDotNetDictionaryId);
    if (!bVar2) {
      while( true ) {
        ON_wString::ON_wString(&local_60);
        iVar3 = ON_BinaryArchive::BeginReadDictionaryEntry
                          (binary_archive,(int *)&local_64,&local_60);
        if (iVar3 != 1) break;
        pDVar4 = DictionaryEntry::CreateInstance(local_64);
        if (pDVar4 == (DictionaryEntry *)0x0) {
          ON_WarningEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archivable_dictionary.cpp"
                       ,0x164,"","Uknown ArchivableDictionary item type %d.",(ulong)local_64);
        }
        else {
          iVar3 = (*pDVar4->_vptr_DictionaryEntry[5])(pDVar4,binary_archive);
          if ((char)iVar3 == '\0') {
            (*pDVar4->_vptr_DictionaryEntry[1])(pDVar4);
            goto LAB_0038c028;
          }
          pmVar5 = std::
                   map<ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
                   ::operator[](&this->m_private->m_map,&local_60);
          pDVar1 = (pmVar5->_M_t).
                   super___uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>.
                   super__Head_base<0UL,_DictionaryEntry_*,_false>._M_head_impl;
          (pmVar5->_M_t).
          super___uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>._M_t.
          super__Tuple_impl<0UL,_DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>.
          super__Head_base<0UL,_DictionaryEntry_*,_false>._M_head_impl = pDVar4;
          if (pDVar1 != (DictionaryEntry *)0x0) {
            (*pDVar1->_vptr_DictionaryEntry[1])();
          }
        }
        bVar2 = ON_BinaryArchive::EndReadDictionaryEntry(binary_archive);
        if (!bVar2) goto LAB_0038c028;
        ON_wString::~ON_wString(&local_60);
      }
      if (iVar3 == 2) {
        ON_wString::~ON_wString(&local_60);
        bVar2 = ON_BinaryArchive::EndReadDictionary(binary_archive);
        goto LAB_0038c034;
      }
LAB_0038c028:
      ON_wString::~ON_wString(&local_60);
    }
  }
  bVar2 = false;
LAB_0038c034:
  ON_wString::~ON_wString(&local_58);
  return bVar2;
}

Assistant:

bool ON_ArchivableDictionary::Read(ON_BinaryArchive& binary_archive)
{
  ON_UUID dictionary_id = {};
  unsigned int dictionary_version = {};
  ON_wString dictionary_name;
  m_private->m_map.clear();

  if (!binary_archive.BeginReadDictionary(&dictionary_id, &dictionary_version, dictionary_name))
    return false;

  if (dictionary_id != RhinoDotNetDictionaryId)
    return false;

  while (true)
  {
    int        item_type;
    ON_wString item_name;
    auto rc = binary_archive.BeginReadDictionaryEntry(&item_type, item_name);
    if (rc == 1)
    {
      std::unique_ptr<DictionaryEntry> value(DictionaryEntry::CreateInstance((DictionaryEntryType)item_type));
      if (value)
      {
        if (!value->ReadDictionaryEntry(binary_archive))
          return false;

        m_private->m_map[item_name] = std::move(value);
      }
      else
      {
        // We skip unknown item types
        ON_WarningEx(__FILE__, __LINE__, OPENNURBS__FUNCTION__, "Uknown ArchivableDictionary item type %d.", item_type);
      }
    }
    else if (rc == 2) break;
    else              return false;

    if (!binary_archive.EndReadDictionaryEntry())
      return false;
  }

  return binary_archive.EndReadDictionary();
}